

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
removeGarbageUntilUnder
          (GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *this,int limit,Random *rnd)

{
  InternalError *this_00;
  char *pcVar1;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28;
  int local_24;
  int memReleased;
  int memUsage;
  Random *rnd_local;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *pGStack_10;
  int limit_local;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *this_local;
  
  _memReleased = rnd;
  rnd_local._4_4_ = limit;
  pGStack_10 = this;
  local_24 = computeApproxMemUsage(this);
  while( true ) {
    if (local_24 <= rnd_local._4_4_) {
      return;
    }
    local_28 = removeRandomGarbage(this,_memReleased);
    if (local_28 < 0) break;
    local_24 = local_24 - local_28;
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
  std::operator+(&local_c8,&local_e8,"Given ");
  pcVar1 = objTypeName();
  std::operator+(&local_a8,&local_c8,pcVar1);
  std::operator+(&local_88,&local_a8," memory usage limit exceeded, and no unneeded ");
  pcVar1 = objTypeName();
  std::operator+(&local_68,&local_88,pcVar1);
  std::operator+(&local_48,&local_68," resources available to release");
  tcu::InternalError::InternalError(this_00,&local_48);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

void GLObjectManager<T>::removeGarbageUntilUnder (const int limit, Random& rnd)
{
	int memUsage = computeApproxMemUsage();

	while (memUsage > limit)
	{
		const int memReleased = removeRandomGarbage(rnd);
		if (memReleased < 0)
			throw tcu::InternalError(string("") + "Given " + objTypeName() + " memory usage limit exceeded, and no unneeded " + objTypeName() + " resources available to release");
		memUsage -= memReleased;
		DE_ASSERT(memUsage == computeApproxMemUsage());
	}
}